

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O0

void Bac_ManFree(Bac_Man_t *p)

{
  int iVar1;
  Bac_Ntk_t *p_00;
  int local_1c;
  int i;
  Bac_Ntk_t *pNtk;
  Bac_Man_t *p_local;
  
  for (local_1c = 1; iVar1 = Bac_ManNtkNum(p), local_1c <= iVar1; local_1c = local_1c + 1) {
    p_00 = Bac_ManNtk(p,local_1c);
    Bac_NtkFree(p_00);
  }
  Vec_IntErase(&p->vBuf2LeafNtk);
  Vec_IntErase(&p->vBuf2LeafObj);
  Vec_IntErase(&p->vBuf2RootNtk);
  Vec_IntErase(&p->vBuf2RootObj);
  Abc_NamDeref(p->pStrs);
  Abc_NamDeref(p->pMods);
  if (p->pName != (char *)0x0) {
    free(p->pName);
    p->pName = (char *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  if (p->pNtks != (Bac_Ntk_t *)0x0) {
    free(p->pNtks);
    p->pNtks = (Bac_Ntk_t *)0x0;
  }
  if (p != (Bac_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

static inline void Bac_ManFree( Bac_Man_t * p )
{
    Bac_Ntk_t * pNtk; int i;
    Bac_ManForEachNtk( p, pNtk, i )
        Bac_NtkFree( pNtk );
    Vec_IntErase( &p->vBuf2LeafNtk );
    Vec_IntErase( &p->vBuf2LeafObj );
    Vec_IntErase( &p->vBuf2RootNtk );
    Vec_IntErase( &p->vBuf2RootObj );
    Abc_NamDeref( p->pStrs );
    Abc_NamDeref( p->pMods );
    ABC_FREE( p->pName );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pNtks );
    ABC_FREE( p );
}